

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

bool __thiscall QFileDevice::setPermissions(QFileDevice *this,Permissions permissions)

{
  int iVar1;
  Int IVar2;
  QFileDevicePrivate *this_00;
  undefined4 extraout_var;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QFileDevicePrivate *d;
  FileError in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QFlags<QFileDevice::Permission> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDevice *)0x12f2de);
  iVar1 = (*(this_00->super_QIODevicePrivate)._vptr_QIODevicePrivate[5])();
  IVar2 = QFlags<QFileDevice::Permission>::toInt(&local_c);
  uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xb8))
                    ((long *)CONCAT44(extraout_var,iVar1),IVar2);
  bVar4 = (uVar3 & 1) != 0;
  if (bVar4) {
    unsetError((QFileDevice *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  }
  else {
    std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
              ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
               0x12f33f);
    QAbstractFileEngine::errorString((QAbstractFileEngine *)this_00);
    QFileDevicePrivate::setError
              ((QFileDevicePrivate *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,(QString *)0x12f360);
    QString::~QString((QString *)0x12f36a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::setPermissions(Permissions permissions)
{
    Q_D(QFileDevice);
    if (d->engine()->setPermissions(permissions.toInt())) {
        unsetError();
        return true;
    }
    d->setError(QFile::PermissionsError, d->fileEngine->errorString());
    return false;
}